

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePath.h
# Opt level: O2

void __thiscall Js::TypePath::SetMaxInitializedLength(TypePath *this,int newMaxInitializedLength)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Data *pDVar4;
  
  if (newMaxInitializedLength < 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/TypePath.h"
                                ,0x155,"(newMaxInitializedLength >= 0)",
                                "newMaxInitializedLength >= 0");
    if (!bVar2) goto LAB_00c557c8;
    *puVar3 = 0;
LAB_00c55722:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/TypePath.h"
                                ,0x156,"(newMaxInitializedLength <= MaxPathTypeHandlerLength)",
                                "newMaxInitializedLength <= MaxPathTypeHandlerLength");
    if (!bVar2) goto LAB_00c557c8;
    *puVar3 = 0;
  }
  else if (0x80 < (uint)newMaxInitializedLength) {
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    goto LAB_00c55722;
  }
  pDVar4 = (this->data).ptr;
  if (newMaxInitializedLength < (int)(uint)pDVar4->maxInitializedLength) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/TypePath.h"
                                ,0x157,
                                "(this->GetMaxInitializedLength() <= newMaxInitializedLength)",
                                "this->GetMaxInitializedLength() <= newMaxInitializedLength");
    if (!bVar2) {
LAB_00c557c8:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    pDVar4 = (this->data).ptr;
  }
  pDVar4->maxInitializedLength = (Type)newMaxInitializedLength;
  return;
}

Assistant:

void SetMaxInitializedLength(int newMaxInitializedLength)
        {
            Assert(newMaxInitializedLength >= 0);
            Assert(newMaxInitializedLength <= MaxPathTypeHandlerLength);
            Assert(this->GetMaxInitializedLength() <= newMaxInitializedLength);
            this->GetData()->maxInitializedLength = (uint8)newMaxInitializedLength;
        }